

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

uint __thiscall IR::Instr::GetAsmJsArgOutSize(Instr *this)

{
  OpCode OVar1;
  IntConstOpnd *pIVar2;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  StackSym *pSVar8;
  undefined4 *puVar9;
  
  OVar1 = this->m_opcode;
  if ((OVar1 == StartCall) || (OVar1 == LoweredStartCall)) {
    pIVar2 = (IntConstOpnd *)this->m_src2;
    OVar4 = Opnd::GetKind((Opnd *)pIVar2);
    if (OVar4 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar5) goto LAB_004c2b86;
      *puVar9 = 0;
    }
    uVar6 = IntConstOpnd::AsUint32(pIVar2);
    return uVar6;
  }
  if (OVar1 == InlineeEnd) {
    while ((this->m_opcode != StartCall && (this->m_opcode != LoweredStartCall))) {
      pSVar8 = Opnd::GetStackSym(this->m_src2);
      if ((pSVar8->field_0x18 & 1) == 0) {
        this = (Instr *)0x0;
      }
      else {
        this = (pSVar8->field_5).m_instrDef;
      }
    }
    pIVar2 = (IntConstOpnd *)this->m_src2;
    OVar4 = Opnd::GetKind((Opnd *)pIVar2);
    if (OVar4 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar5) goto LAB_004c2b86;
      *puVar9 = 0;
    }
    uVar6 = IntConstOpnd::AsUint32(pIVar2);
    if (0xffffffe7 < uVar6) {
      Math::DefaultOverflowPolicy();
    }
    uVar7 = uVar6 + 0x18;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xe56,"((0))","UNREACHED");
    if (!bVar5) {
LAB_004c2b86:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
    uVar7 = 0;
  }
  return uVar7;
}

Assistant:

uint Instr::GetAsmJsArgOutSize()
{
    switch (m_opcode)
    {
    case Js::OpCode::StartCall:
    case Js::OpCode::LoweredStartCall:
        return GetSrc2()->AsIntConstOpnd()->AsUint32();

    case Js::OpCode::InlineeEnd:
    {
        // StartCall instr has the size, so walk back to it
        IR::Instr *argInstr = this;
        while(argInstr->m_opcode != Js::OpCode::StartCall && argInstr->m_opcode != Js::OpCode::LoweredStartCall)
        {
            argInstr = argInstr->GetSrc2()->GetStackSym()->GetInstrDef();
        }
        // add StartCall arg size with inlinee meta args for full size
        uint size = UInt32Math::Add(argInstr->GetSrc2()->AsIntConstOpnd()->AsUint32(), Js::Constants::InlineeMetaArgCount * MachPtr);
        return size;
    }
    default:
        Assert(UNREACHED);
        return 0;
    }
    }